

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertFromStruct
          (JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *this,
          vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *list)

{
  pointer pPVar1;
  pointer data;
  PsbtMapData object;
  PsbtMapData PStack_98;
  
  pPVar1 = (list->super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (data = (list->super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>).
              _M_impl.super__Vector_impl_data._M_start; data != pPVar1; data = data + 1) {
    cfd::api::json::PsbtMapData::PsbtMapData(&PStack_98);
    cfd::api::json::PsbtMapData::ConvertFromStruct(&PStack_98,data);
    ::std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>::
    push_back(&(this->super_JsonVector<cfd::api::json::PsbtMapData>).
               super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
              ,&PStack_98);
    cfd::api::json::PsbtMapData::~PsbtMapData(&PStack_98);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }